

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O1

_Bool roaring64_iterator_advance(roaring64_iterator_t *it)

{
  art_val_t *paVar1;
  _Bool _Var2;
  roaring_container_iterator_t rVar3;
  ulong uVar4;
  ulong uVar5;
  uint16_t low16;
  uint16_t low16_1;
  ushort local_a2;
  art_iterator_t local_a0;
  
  paVar1 = (it->art_it).value;
  if (paVar1 == (art_val_t *)0x0) {
    if (it->saturated_forward != true) {
      art_init_iterator(&local_a0,&it->parent->art,true);
      memcpy(&it->art_it,&local_a0,0x88);
      paVar1 = (it->art_it).value;
      it->has_value = paVar1 != (art_val_t *)0x0;
      if (paVar1 == (art_val_t *)0x0) {
        it->saturated_forward = true;
      }
      else {
        uVar4 = (ulong)*(ushort *)((it->art_it).key + 4) << 0x20;
        uVar5 = (ulong)*(uint6 *)(it->art_it).key;
        it->high48 = (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                     (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
                     (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
        local_a0.key[0] = '\0';
        local_a0.key[1] = '\0';
        rVar3 = container_init_iterator
                          (*(container_t **)(paVar1[1].key + 2),paVar1[1].key[0],
                           (uint16_t *)&local_a0);
        (it->container_it).index = rVar3.index;
        it->value = (ulong)(ushort)local_a0.key._0_2_ | it->high48;
        it->has_value = true;
      }
      return it->has_value;
    }
    it->has_value = false;
LAB_0010ec48:
    _Var2 = false;
  }
  else {
    local_a2 = (ushort)it->value;
    _Var2 = container_iterator_next
                      (*(container_t **)(paVar1[1].key + 2),paVar1[1].key[0],&it->container_it,
                       &local_a2);
    local_a0.key._0_2_ = local_a2;
    if (!_Var2) {
      _Var2 = art_iterator_next(&it->art_it);
      if (!_Var2) {
        it->has_value = false;
        it->saturated_forward = true;
        goto LAB_0010ec48;
      }
      uVar4 = (ulong)*(ushort *)((it->art_it).key + 4) << 0x20;
      uVar5 = (ulong)*(uint6 *)(it->art_it).key;
      it->high48 = (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                   (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28
                   | uVar5 << 0x38;
      paVar1 = (it->art_it).value;
      local_a0.key[0] = '\0';
      local_a0.key[1] = '\0';
      rVar3 = container_init_iterator
                        (*(container_t **)(paVar1[1].key + 2),paVar1[1].key[0],(uint16_t *)&local_a0
                        );
      (it->container_it).index = rVar3.index;
    }
    it->value = (ulong)(ushort)local_a0.key._0_2_ | it->high48;
    it->has_value = true;
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

bool roaring64_iterator_advance(roaring64_iterator_t *it) {
    if (it->art_it.value == NULL) {
        if (it->saturated_forward) {
            return (it->has_value = false);
        }
        roaring64_iterator_init_at(it->parent, it, /*first=*/true);
        return it->has_value;
    }
    leaf_t *leaf = (leaf_t *)it->art_it.value;
    uint16_t low16 = (uint16_t)it->value;
    if (container_iterator_next(leaf->container, leaf->typecode,
                                &it->container_it, &low16)) {
        it->value = it->high48 | low16;
        return (it->has_value = true);
    }
    if (art_iterator_next(&it->art_it)) {
        return roaring64_iterator_init_at_leaf_first(it);
    }
    it->saturated_forward = true;
    return (it->has_value = false);
}